

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O2

ON_2dPoint __thiscall
ON_PeriodicDomain::LiftToCover(ON_PeriodicDomain *this,ON_2dPoint Pin,bool stealth)

{
  undefined8 uVar1;
  int i_1;
  int iVar2;
  int i;
  long lVar3;
  ON_PeriodicDomain *this_00;
  int i_2;
  long lVar4;
  double __x;
  double dVar5;
  double dVar6;
  double dVar7;
  ON_2dPoint OVar8;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  int deck_in [2];
  
  local_50 = Pin.y;
  local_48 = Pin.x;
  deck_in[0] = 0;
  deck_in[1] = 0;
  lVar3 = 0;
  for (lVar4 = -0x20; lVar4 != 0; lVar4 = lVar4 + 0x10) {
    dVar6 = local_48;
    if (lVar4 != -0x20) {
      dVar6 = local_50;
    }
    __x = ON_Interval::NormalizedParameterAt((ON_Interval *)(this->m_closed + lVar4),dVar6);
    dVar6 = local_58;
    dVar7 = __x;
    if (lVar4 != -0x20) {
      dVar6 = __x;
      dVar7 = local_60;
    }
    if (this->m_closed[lVar3] == true) {
      dVar5 = floor(__x);
      deck_in[lVar3] = (int)dVar5;
      dVar6 = __x - (double)(int)dVar5;
      dVar7 = local_60;
      if (lVar4 == -0x20) {
        dVar6 = local_58;
        dVar7 = __x - (double)(int)dVar5;
      }
    }
    lVar3 = lVar3 + 1;
    local_60 = dVar7;
    local_58 = dVar6;
  }
  dVar6 = (this->m_nprev).x;
  if ((dVar6 == ON_2dPoint::UnsetPoint.x) && (!NAN(dVar6) && !NAN(ON_2dPoint::UnsetPoint.x))) {
    dVar6 = (this->m_nprev).y;
    if ((dVar6 == ON_2dPoint::UnsetPoint.y) && (!NAN(dVar6) && !NAN(ON_2dPoint::UnsetPoint.y))) {
      if (!stealth) {
        (this->m_nprev).x = local_60;
        (this->m_nprev).y = local_58;
        *&this->m_deck = deck_in;
      }
      goto LAB_0058e3b0;
    }
  }
  uVar1 = *(undefined8 *)this->m_deck;
  dVar6 = this->m_normband;
  for (lVar4 = 0; lVar4 != 2; lVar4 = lVar4 + 1) {
    if (this->m_closed[lVar4] == true) {
      dVar7 = local_60;
      if (lVar4 != 0) {
        dVar7 = local_58;
      }
      if (((*(double *)(this->m_deck + (ulong)(lVar4 != 0) * 2 + 2) < dVar6) &&
          (iVar2 = -1, 1.0 - dVar6 < dVar7)) ||
         ((1.0 - dVar6 < *(double *)(this->m_deck + (ulong)(lVar4 != 0) * 2 + 2) &&
          (iVar2 = 1, dVar7 < dVar6)))) {
        deck_in[lVar4 + -2] = deck_in[lVar4 + -2] + iVar2;
      }
    }
  }
  this_00 = this;
  for (lVar4 = 0; lVar4 != 2; lVar4 = lVar4 + 1) {
    dVar6 = local_60;
    if (lVar4 != 0) {
      dVar6 = local_58;
    }
    dVar6 = ON_Interval::ParameterAt(this_00->m_dom,(double)deck_in[lVar4 + -2] + dVar6);
    if (lVar4 != 0) {
      local_50 = dVar6;
      dVar6 = local_48;
    }
    local_48 = dVar6;
    this_00 = (ON_PeriodicDomain *)(this_00->m_dom + 1);
  }
  if (!stealth) {
    *(undefined8 *)this->m_deck = uVar1;
    (this->m_nprev).x = local_60;
    (this->m_nprev).y = local_58;
  }
LAB_0058e3b0:
  OVar8.y = local_50;
  OVar8.x = local_48;
  return OVar8;
}

Assistant:

ON_2dPoint ON_PeriodicDomain::LiftToCover(ON_2dPoint Pin, bool stealth )
{
	ON_2dPoint out = Pin;
	ON_2dPoint nnext;
	int deck_in[2] = { 0,0 };
	//  decompose Pin
	//     Pin = m_dom.ParameterAt( deck + nnext)
	// where nnext[i] is in [0.0, 1.0)
	for (int i = 0; i < 2; i++)
	{
		nnext[i] = m_dom[i].NormalizedParameterAt(out[i]);
		if (m_closed[i])
		{
			deck_in[i] = int(floor(nnext[i]));
			nnext[i] -= deck_in[i];
		}
	}


	if (m_nprev == ON_2dPoint::UnsetPoint)
	{
		if( !stealth)
		{ 
			m_nprev = nnext;
			m_deck[0] = deck_in[0];
			m_deck[1] = deck_in[1];
		}
		return Pin;
	}

	int deck[2] = { m_deck[0], m_deck[1] };
	for (int i = 0; i < 2; i++)
	{
		if (!m_closed[i])
			continue;
		if (m_nprev[i]<m_normband &&  nnext[i]>1.0 - m_normband)
			deck[i] --;
		else if (m_nprev[i] > 1.0 - m_normband && nnext[i] < m_normband)
			deck[i]++;
	}

	for (int i = 0; i < 2; i++)
		out[i] = m_dom[i].ParameterAt(deck[i] + nnext[i]);
	
	if (!stealth)
	{
		m_deck[0] = deck[0]; 
		m_deck[1] = deck[1];
		m_nprev = nnext;
	}

	return out;
}